

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::CoreFactory::CoreBuilder> *
helics::CoreFactory::MasterCoreBuilder::getBuilder(int code)

{
  element_type *peVar1;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>
  *builder;
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *psVar2;
  pointer ptVar3;
  HelicsException *this;
  string_view message;
  
  psVar2 = instance();
  peVar1 = (psVar2->
           super___shared_ptr<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ptVar3 = (peVar1->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ptVar3 == (peVar1->builders).
                  super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "core type is not available";
      message._M_len = 0x1a;
      HelicsException::HelicsException(this,message);
      __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
    }
    if ((ptVar3->
        super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>
        ).super__Head_base<0UL,_int,_false>._M_head_impl == code) break;
    ptVar3 = ptVar3 + 1;
  }
  return (shared_ptr<helics::CoreFactory::CoreBuilder> *)ptVar3;
}

Assistant:

static const std::shared_ptr<CoreBuilder>& getBuilder(int code)
    {
        for (auto& builder : instance()->builders) {
            if (std::get<0>(builder) == code) {
                return std::get<2>(builder);
            }
        }
        throw(HelicsException("core type is not available"));
    }